

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O1

void rd_string(char *str,int max)

{
  uint8_t uVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    uVar1 = sf_get();
    if (lVar2 < max) {
      str[lVar2] = uVar1;
    }
    lVar2 = lVar2 + 1;
  } while (uVar1 != '\0');
  str[(long)max + -1] = '\0';
  return;
}

Assistant:

void rd_string(char *str, int max)
{
	uint8_t tmp8u;
	int i = 0;

	do {
		rd_byte(&tmp8u);

		if (i < max) str[i] = tmp8u;
		if (!tmp8u) break;
	} while (++i);

	str[max - 1] = '\0';
}